

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btSoftBodyConcaveCollisionAlgorithm::processCollision
          (btSoftBodyConcaveCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  bool bVar1;
  btCollisionObject *this_00;
  btCollisionShape *pbVar2;
  btVector3 *pbVar3;
  btVector3 *pbVar4;
  btCollisionObjectWrapper *in_RDX;
  btCollisionObjectWrapper *in_RSI;
  long in_RDI;
  btScalar collisionMarginTriangle;
  btConcaveShape *concaveShape;
  btCollisionObject *triOb;
  btCollisionObjectWrapper *triBody;
  btManifoldResult *in_stack_00000100;
  btDispatcherInfo *in_stack_00000108;
  btCollisionObjectWrapper *in_stack_00000110;
  btScalar in_stack_0000011c;
  btSoftBodyTriangleCallback *in_stack_00000120;
  btCollisionObjectWrapper *local_58;
  
  local_58 = in_RDX;
  if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
    local_58 = in_RSI;
  }
  btCollisionObjectWrapper::getCollisionShape(local_58);
  bVar1 = btCollisionShape::isConcave((btCollisionShape *)0x28cfef);
  if (bVar1) {
    this_00 = btCollisionObjectWrapper::getCollisionObject(local_58);
    pbVar2 = btCollisionObject::getCollisionShape(this_00);
    (*pbVar2->_vptr_btCollisionShape[0xc])();
    btSoftBodyTriangleCallback::setTimeStepAndCounters
              (in_stack_00000120,in_stack_0000011c,in_stack_00000110,in_stack_00000108,
               in_stack_00000100);
    pbVar3 = btSoftBodyTriangleCallback::getAabbMin((btSoftBodyTriangleCallback *)(in_RDI + 0x18));
    pbVar4 = btSoftBodyTriangleCallback::getAabbMax((btSoftBodyTriangleCallback *)(in_RDI + 0x18));
    (*pbVar2->_vptr_btCollisionShape[0x10])(pbVar2,in_RDI + 0x18,pbVar3,pbVar4);
  }
  return;
}

Assistant:

void btSoftBodyConcaveCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{


	//btCollisionObject* convexBody = m_isSwapped ? body1 : body0;
	const btCollisionObjectWrapper* triBody = m_isSwapped ? body0Wrap : body1Wrap;

	if (triBody->getCollisionShape()->isConcave())
	{


		const btCollisionObject*	triOb = triBody->getCollisionObject();
		const btConcaveShape* concaveShape = static_cast<const btConcaveShape*>( triOb->getCollisionShape());

		//	if (convexBody->getCollisionShape()->isConvex())
		{
			btScalar collisionMarginTriangle = concaveShape->getMargin();

			//			resultOut->setPersistentManifold(m_btSoftBodyTriangleCallback.m_manifoldPtr);
			m_btSoftBodyTriangleCallback.setTimeStepAndCounters(collisionMarginTriangle,triBody,dispatchInfo,resultOut);

		
			concaveShape->processAllTriangles( &m_btSoftBodyTriangleCallback,m_btSoftBodyTriangleCallback.getAabbMin(),m_btSoftBodyTriangleCallback.getAabbMax());

			//	resultOut->refreshContactPoints();

		}

	}

}